

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O0

void spell_electrocute(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  bool bVar1;
  long in_RCX;
  int tconduct;
  OBJ_DATA *obj;
  CHAR_DATA *victim;
  undefined1 in_stack_00001312;
  undefined1 in_stack_00001313;
  int in_stack_00001314;
  int in_stack_00001318;
  int in_stack_0000131c;
  CHAR_DATA *in_stack_00001320;
  CHAR_DATA *in_stack_00001328;
  int in_stack_00001348;
  int in_stack_00001350;
  char *in_stack_00001358;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  char *in_stack_ffffffffffffffb0;
  int local_34;
  OBJ_DATA *local_30;
  
  local_34 = 0;
  for (local_30 = *(OBJ_DATA **)(in_RCX + 0x98); local_30 != (OBJ_DATA *)0x0;
      local_30 = local_30->next_content) {
    if ((-1 < local_30->pIndexData->material_index) && (bVar1 = is_worn(local_30), bVar1)) {
      local_34 = material_table[local_30->pIndexData->material_index].mat_conductivity + local_34;
    }
  }
  act(in_stack_ffffffffffffffb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
      (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  act(in_stack_ffffffffffffffb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
      (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  act(in_stack_ffffffffffffffb0,
      (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
      (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
      (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  if (local_34 < 1) {
    act(in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    act(in_stack_ffffffffffffffb0,
        (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
        (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
        (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
  }
  else {
    if (local_34 < 0xf) {
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    else if (local_34 < 0x1e) {
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    else if (local_34 < 0x2d) {
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    else {
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      act(in_stack_ffffffffffffffb0,
          (CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
          (void *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
          (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
    dice(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
    uVar2 = 0;
    damage_new(in_stack_00001328,in_stack_00001320,in_stack_0000131c,in_stack_00001318,
               in_stack_00001314,(bool)in_stack_00001313,(bool)in_stack_00001312,in_stack_00001348,
               in_stack_00001350,in_stack_00001358);
    LAG_CHAR((CHAR_DATA *)CONCAT44(in_stack_ffffffffffffffa4,uVar2),in_stack_ffffffffffffff9c);
  }
  return;
}

Assistant:

void spell_electrocute(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	OBJ_DATA *obj;
	int tconduct = 0;

	for (obj = victim->carrying; obj != nullptr; obj = obj->next_content)
	{
		if (obj->pIndexData->material_index < 0)
			continue;

		if (!is_worn(obj))
			continue;

		tconduct += material_table[obj->pIndexData->material_index].mat_conductivity;
	}

	act("You attempt to send an electric current though $N's armor.", ch, 0, victim, TO_CHAR);
	act("$n attempts to send an electric current though your armor.", ch, 0, victim, TO_VICT);
	act("$n attempts to send an electric current though $N's armor.", ch, 0, victim, TO_NOTVICT);

	if (tconduct <= 0)
	{
		act("Your armor harmlessly absorbs the electric charge.", victim, 0, 0, TO_CHAR);
		act("$n's armor harmlessly absorbs the electric charge.", victim, 0, 0, TO_ROOM);
		return;
	}
	else if (tconduct < 15)
	{
		act("You experience a brief jolt of pain as electricity hits your armor.", victim, 0, 0, TO_CHAR);
		act("$n jerks slightly as $s armor crackles with electricity.", victim, 0, 0, TO_ROOM);
	}
	else if (tconduct < 30)
	{
		act("Your body is wracked with pain as electricity surges through you!", victim, 0, 0, TO_CHAR);
		act("$n convulses as bursts of electricity explode through $s armor!", victim, 0, 0, TO_ROOM);
	}
	else if (tconduct < 45)
	{
		act("You open your mouth in a silent scream as raw electricity explodes through your joints!", victim, 0, 0, TO_CHAR);
		act("$n's face contorts in agony as $e convulses, briefly paralyzed!", victim, 0, 0, TO_ROOM);
	}
	else
	{
		act("Every inch of your body explodes with pain, your flesh melting as electricity courses into your body!", victim, 0, 0, TO_CHAR);
		act("$n lets out a horrible shriek as the electric current roasts $m alive within $s armor!", victim, 0, 0, TO_ROOM);
	}

	damage_new(ch, victim, dice((level / 15) * tconduct, 4), sn, DAM_LIGHTNING, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, nullptr);
	LAG_CHAR(victim, (tconduct / 15) * PULSE_VIOLENCE);
}